

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O3

void * rw::ps2::mallocalign(size_t size,int32 alignment)

{
  long lVar1;
  void *pvVar2;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp line: 89"
  ;
  lVar1 = (*Engine::memfuncs)(size + (long)alignment + 8,0x30a04);
  if (lVar1 == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)((long)-alignment & (long)alignment + 8 + lVar1);
    *(long *)((long)pvVar2 + -8) = lVar1;
  }
  return pvVar2;
}

Assistant:

void*
mallocalign(size_t size, int32 alignment)
{
	void *p;
	void **pp;
	p = rwMalloc(size + alignment + sizeof(void*), MEMDUR_EVENT | ID_RASTERPS2);
	if(p == nil) return nil;
	pp = (void**)(((uintptr)p + sizeof(void*) + alignment)&~(alignment-1));
	pp[-1] = p;
	return (void*)pp;
}